

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReaderWriter.h
# Opt level: O0

int __thiscall JetHead::IReaderWriter::readAll(IReaderWriter *this,void *buffer,int length)

{
  int iVar1;
  int local_28;
  int result;
  int bytesRead;
  int length_local;
  void *buffer_local;
  IReaderWriter *this_local;
  
  local_28 = 0;
  while( true ) {
    if (length <= local_28) {
      return local_28;
    }
    iVar1 = (*this->_vptr_IReaderWriter[2])
                      (this,(long)buffer + (long)local_28,(ulong)(uint)(length - local_28));
    if (iVar1 < 0) break;
    if (iVar1 == 0) {
      return local_28;
    }
    local_28 = iVar1 + local_28;
  }
  return iVar1;
}

Assistant:

virtual int readAll(void *buffer, int length)
		{
			int bytesRead = 0;
			
			while (bytesRead < length)
			{
				int result = read((uint8_t*)buffer + bytesRead,
								  length - bytesRead);
				
				if (result < 0)
					return result;
				
				if (result == 0)
					return bytesRead;
				
				bytesRead += result;
			}
			return bytesRead;
		}